

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieGia.c
# Opt level: O1

Gia_Man_t * Abc_NtkFlattenHierarchyGia(Abc_Ntk_t *pNtk,Vec_Ptr_t **pvBuffers,int fVerbose)

{
  char *pcVar1;
  void *pvVar2;
  Gia_Obj_t *pGVar3;
  int iVar4;
  Vec_Ptr_t *vBuffers;
  void **ppvVar5;
  Gia_Man_t *pGVar6;
  size_t sVar7;
  char *pcVar8;
  Gia_Obj_t *pGVar9;
  Vec_Ptr_t *vSupers;
  Vec_Ptr_t *pVVar10;
  Gia_Man_t *p;
  long lVar11;
  int iVar12;
  uint uVar13;
  ulong uVar14;
  
  vBuffers = (Vec_Ptr_t *)malloc(0x10);
  vBuffers->nCap = 1000;
  vBuffers->nSize = 0;
  ppvVar5 = (void **)malloc(8000);
  vBuffers->pArray = ppvVar5;
  if (pNtk->ntkType != ABC_NTK_NETLIST) {
    __assert_fail("Abc_NtkIsNetlist(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHieGia.c"
                  ,0x1ab,"Gia_Man_t *Abc_NtkFlattenHierarchyGia(Abc_Ntk_t *, Vec_Ptr_t **, int)");
  }
  iVar12 = pNtk->vPos->nSize + pNtk->vPis->nSize;
  if (pNtk->pDesign == (Abc_Des_t *)0x0) {
    iVar4 = Gia_ManFlattenLogicPrepare(pNtk);
    uVar13 = iVar4 - iVar12;
  }
  else {
    uVar13 = -iVar12;
    pVVar10 = pNtk->pDesign->vModules;
    if (0 < pVVar10->nSize) {
      lVar11 = 0;
      do {
        iVar12 = Gia_ManFlattenLogicPrepare((Abc_Ntk_t *)pVVar10->pArray[lVar11]);
        uVar13 = uVar13 + iVar12;
        lVar11 = lVar11 + 1;
        pVVar10 = pNtk->pDesign->vModules;
      } while (lVar11 < pVVar10->nSize);
    }
  }
  pGVar6 = Gia_ManStart(pNtk->vObjs->nSize);
  pcVar1 = pNtk->pName;
  if (pcVar1 == (char *)0x0) {
    pcVar8 = (char *)0x0;
  }
  else {
    sVar7 = strlen(pcVar1);
    pcVar8 = (char *)malloc(sVar7 + 1);
    strcpy(pcVar8,pcVar1);
  }
  pGVar6->pName = pcVar8;
  pcVar1 = pNtk->pSpec;
  if (pcVar1 == (char *)0x0) {
    pcVar8 = (char *)0x0;
  }
  else {
    sVar7 = strlen(pcVar1);
    pcVar8 = (char *)malloc(sVar7 + 1);
    strcpy(pcVar8,pcVar1);
  }
  pGVar6->pSpec = pcVar8;
  pVVar10 = pNtk->vPis;
  if (0 < pVVar10->nSize) {
    lVar11 = 0;
    do {
      pvVar2 = pVVar10->pArray[lVar11];
      pGVar9 = Gia_ManAppendObj(pGVar6);
      uVar14 = *(ulong *)pGVar9;
      *(ulong *)pGVar9 = uVar14 | 0x9fffffff;
      *(ulong *)pGVar9 =
           uVar14 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(pGVar6->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar3 = pGVar6->pObjs;
      if ((pGVar9 < pGVar3) || (pGVar3 + pGVar6->nObjs <= pGVar9)) {
LAB_0084e22e:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(pGVar6->vCis,(int)((ulong)((long)pGVar9 - (long)pGVar3) >> 2) * -0x55555555);
      pGVar3 = pGVar6->pObjs;
      if ((pGVar9 < pGVar3) || (pGVar3 + pGVar6->nObjs <= pGVar9)) goto LAB_0084e22e;
      *(int *)((long)pvVar2 + 0x40) = (int)((ulong)((long)pGVar9 - (long)pGVar3) >> 2) * 0x55555556;
      lVar11 = lVar11 + 1;
      pVVar10 = pNtk->vPis;
    } while (lVar11 < pVVar10->nSize);
  }
  vSupers = (Vec_Ptr_t *)malloc(0x10);
  vSupers->nCap = 100;
  vSupers->nSize = 0;
  ppvVar5 = (void **)malloc(800);
  vSupers->pArray = ppvVar5;
  Gia_ManHashAlloc(pGVar6);
  pVVar10 = pNtk->vPos;
  if (0 < pVVar10->nSize) {
    lVar11 = 0;
    do {
      Abc_NtkFlattenHierarchyGia_rec(pGVar6,vSupers,(Abc_Obj_t *)pVVar10->pArray[lVar11],vBuffers);
      lVar11 = lVar11 + 1;
      pVVar10 = pNtk->vPos;
    } while (lVar11 < pVVar10->nSize);
  }
  Gia_ManHashStop(pGVar6);
  if (vSupers->pArray != (void **)0x0) {
    free(vSupers->pArray);
    vSupers->pArray = (void **)0x0;
  }
  free(vSupers);
  if (pNtk->pDesign == (Abc_Des_t *)0x0) {
    uVar14 = 0;
  }
  else {
    uVar14 = (ulong)(pNtk->pDesign->vModules->nSize - 1);
  }
  printf("Hierarchy reader flattened %d instances of boxes and added %d barbufs (out of %d).\n",
         uVar14,(ulong)(uint)vBuffers->nSize,(ulong)uVar13);
  pVVar10 = pNtk->vPos;
  if (0 < pVVar10->nSize) {
    lVar11 = 0;
    do {
      Gia_ManAppendCo(pGVar6,*(int *)((long)pVVar10->pArray[lVar11] + 0x40));
      lVar11 = lVar11 + 1;
      pVVar10 = pNtk->vPos;
    } while (lVar11 < pVVar10->nSize);
  }
  if (pvBuffers == (Vec_Ptr_t **)0x0) {
    if (vBuffers->pArray != (void **)0x0) {
      free(vBuffers->pArray);
      vBuffers->pArray = (void **)0x0;
    }
    free(vBuffers);
  }
  else {
    *pvBuffers = vBuffers;
  }
  p = Gia_ManCleanup(pGVar6);
  Gia_ManStop(pGVar6);
  pGVar6 = Gia_ManSweepHierarchy(p);
  Gia_ManStop(p);
  return pGVar6;
}

Assistant:

Gia_Man_t * Abc_NtkFlattenHierarchyGia( Abc_Ntk_t * pNtk, Vec_Ptr_t ** pvBuffers, int fVerbose )
{
    int fUseBufs = 1;
    Gia_Man_t * pNew, * pTemp; 
    Abc_Ntk_t * pModel;
    Abc_Obj_t * pTerm;
    Vec_Ptr_t * vSupers;
    Vec_Ptr_t * vBuffers = fUseBufs ? Vec_PtrAlloc(1000) : NULL;
    int i, Counter = 0; 
    assert( Abc_NtkIsNetlist(pNtk) );
//    Abc_NtkPrintBoxInfo( pNtk );

    // set the PI/PO numbers
    Counter -= Abc_NtkPiNum(pNtk) + Abc_NtkPoNum(pNtk);
    if ( !pNtk->pDesign )
        Counter += Gia_ManFlattenLogicPrepare( pNtk );
    else
        Vec_PtrForEachEntry( Abc_Ntk_t *, pNtk->pDesign->vModules, pModel, i )
            Counter += Gia_ManFlattenLogicPrepare( pModel );

    // start the manager
    pNew = Gia_ManStart( Abc_NtkObjNumMax(pNtk) );
    pNew->pName = Abc_UtilStrsav(pNtk->pName);
    pNew->pSpec = Abc_UtilStrsav(pNtk->pSpec);

    // create PIs and buffers
    Abc_NtkForEachPi( pNtk, pTerm, i )
        pTerm->iTemp = Gia_ManAppendCi( pNew );

    // call recursively
    vSupers = Vec_PtrAlloc( 100 );
    Gia_ManHashAlloc( pNew );
    Abc_NtkForEachPo( pNtk, pTerm, i )
        Abc_NtkFlattenHierarchyGia_rec( pNew, vSupers, pTerm, vBuffers );
    Gia_ManHashStop( pNew );
    Vec_PtrFree( vSupers );
    printf( "Hierarchy reader flattened %d instances of boxes and added %d barbufs (out of %d).\n", 
        pNtk->pDesign ? Vec_PtrSize(pNtk->pDesign->vModules)-1 : 0, Vec_PtrSize(vBuffers), Counter );

    // create buffers and POs
    Abc_NtkForEachPo( pNtk, pTerm, i )
        Gia_ManAppendCo( pNew, pTerm->iTemp );

    if ( pvBuffers )
        *pvBuffers = vBuffers;
    else
        Vec_PtrFreeP( &vBuffers );

    // cleanup
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
//    Gia_ManPrintStats( pNew, NULL );
    pNew = Gia_ManSweepHierarchy( pTemp = pNew );
    Gia_ManStop( pTemp );
//    Gia_ManPrintStats( pNew, NULL );
    return pNew;
}